

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

void __thiscall
Catch::MultiReporter::assertionEnded(MultiReporter *this,AssertionStats *assertionStats)

{
  pointer puVar1;
  int iVar2;
  IEventListener *pIVar3;
  char cVar4;
  unique_ptr<Catch::IEventListener> *reporterish;
  pointer this_00;
  
  cVar4 = '\x01';
  if ((assertionStats->assertionResult).m_resultData.resultType == Ok) {
    iVar2 = (*((this->super_IEventListener).m_config)->_vptr_IConfig[4])();
    cVar4 = (char)iVar2;
  }
  this_00 = (this->m_reporterLikes).
            super__Vector_base<Catch::Detail::unique_ptr<Catch::IEventListener>,_std::allocator<Catch::Detail::unique_ptr<Catch::IEventListener>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (this->m_reporterLikes).
           super__Vector_base<Catch::Detail::unique_ptr<Catch::IEventListener>,_std::allocator<Catch::Detail::unique_ptr<Catch::IEventListener>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (this_00 == puVar1) {
      return;
    }
    if (cVar4 == '\0') {
      pIVar3 = Detail::unique_ptr<Catch::IEventListener>::operator->(this_00);
      if ((pIVar3->m_preferences).shouldReportAllAssertions == true) goto LAB_00161497;
    }
    else {
LAB_00161497:
      pIVar3 = Detail::unique_ptr<Catch::IEventListener>::operator->(this_00);
      (*pIVar3->_vptr_IEventListener[0xd])(pIVar3,assertionStats);
    }
    this_00 = this_00 + 1;
  } while( true );
}

Assistant:

void MultiReporter::assertionEnded( AssertionStats const& assertionStats ) {
        const bool reportByDefault =
            assertionStats.assertionResult.getResultType() != ResultWas::Ok ||
            m_config->includeSuccessfulResults();

        for ( auto & reporterish : m_reporterLikes ) {
            if ( reportByDefault ||
                 reporterish->getPreferences().shouldReportAllAssertions ) {
                    reporterish->assertionEnded( assertionStats );
            }
        }
    }